

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::banCheck(Server *this)

{
  bool bVar1;
  size_type sVar2;
  pointer pPVar3;
  reference player;
  _Self local_20;
  _Self local_18;
  iterator node;
  Server *this_local;
  
  node._M_node = (_List_node_base *)this;
  sVar2 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                    (&this->players);
  if (sVar2 != 0) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                   (&this->players);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                     (&this->players);
      bVar1 = std::operator==(&local_18,&local_20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_18);
      if ((pPVar3->isBot & 1U) == 0) {
        player = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_18);
        banCheck(this,player);
      }
      std::_List_iterator<RenX::PlayerInfo>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck() {
	if (this->players.size() != 0) {
		for (auto node = this->players.begin(); node != this->players.end(); ++node) {
			if (node->isBot == false) {
				banCheck(*node);
			}
		}
	}
}